

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4-compression.cc
# Opt level: O0

size_t tinyusdz::LZ4Compression::GetCompressedBufferSize(size_t inputSize)

{
  int iVar1;
  size_t sVar2;
  undefined8 local_30;
  size_t sz;
  size_t partChunkSz;
  size_t nWholeChunks;
  size_t inputSize_local;
  
  sVar2 = GetMaxInputSize();
  if (sVar2 < inputSize) {
    inputSize_local = 0;
  }
  else if (inputSize < 0x7e000001) {
    iVar1 = LZ4_compressBound((int)inputSize);
    inputSize_local = (long)iVar1 + 1;
  }
  else {
    iVar1 = LZ4_compressBound(0x7e000000);
    local_30 = (inputSize / 0x7e000000) * ((long)iVar1 + 4) + 1;
    if (inputSize % 0x7e000000 != 0) {
      iVar1 = LZ4_compressBound((int)(inputSize % 0x7e000000));
      local_30 = (long)iVar1 + 4 + local_30;
    }
    inputSize_local = local_30;
  }
  return inputSize_local;
}

Assistant:

size_t LZ4Compression::GetCompressedBufferSize(size_t inputSize) {
  if (inputSize > GetMaxInputSize()) return 0;

  // If it fits in one chunk then it's just the compress bound plus 1.
  if (inputSize <= LZ4_MAX_INPUT_SIZE) {
    return size_t(LZ4_compressBound(int(inputSize))) + 1;
  }
  size_t nWholeChunks = inputSize / LZ4_MAX_INPUT_SIZE;
  size_t partChunkSz = inputSize % LZ4_MAX_INPUT_SIZE;
  size_t sz = 1 + nWholeChunks *
                      (size_t(LZ4_compressBound(LZ4_MAX_INPUT_SIZE)) + sizeof(int32_t));
  if (partChunkSz) sz += size_t(LZ4_compressBound(int(partChunkSz))) + sizeof(int32_t);
  return sz;
}